

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_cookies.cpp
# Opt level: O2

void __thiscall
cppcms::sessions::session_cookies::save
          (session_cookies *this,session_interface *session,string *data,time_t timeout,bool param_4
          ,bool on_server)

{
  encryptor *peVar1;
  cppcms_error *this_00;
  undefined3 in_register_00000089;
  string real_data;
  time_t timeout_local;
  string cipher;
  string local_60;
  string cdata;
  
  timeout_local = timeout;
  if (CONCAT31(in_register_00000089,on_server) == 0) {
    real_data._M_dataplus._M_p = (pointer)&real_data.field_2;
    real_data._M_string_length = 0;
    real_data.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&real_data);
    std::__cxx11::string::append((char *)&real_data,(ulong)&timeout_local);
    std::__cxx11::string::append((string *)&real_data);
    peVar1 = (this->encryptor_)._M_t.
             super___uniq_ptr_impl<cppcms::sessions::encryptor,_std::default_delete<cppcms::sessions::encryptor>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::sessions::encryptor_*,_std::default_delete<cppcms::sessions::encryptor>_>
             .super__Head_base<0UL,_cppcms::sessions::encryptor_*,_false>._M_head_impl;
    (**peVar1->_vptr_encryptor)(&cipher,peVar1,&real_data);
    b64url::encode(&local_60,&cipher);
    std::operator+(&cdata,"C",&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    session_interface::set_session_cookie(session,&cdata);
    std::__cxx11::string::~string((string *)&cdata);
    std::__cxx11::string::~string((string *)&cipher);
    std::__cxx11::string::~string((string *)&real_data);
    return;
  }
  this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&real_data,"Can\'t use cookies backend when data should be stored on server",
             (allocator *)&cipher);
  cppcms_error::cppcms_error(this_00,&real_data);
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void session_cookies::save(session_interface &session,string const &data,time_t timeout,bool /*not_used*/,bool on_server)
{
	if(on_server)
		throw cppcms_error("Can't use cookies backend when data should be stored on server");
	std::string real_data;
	real_data.reserve(data.size() + sizeof(timeout));
	real_data.append(reinterpret_cast<char *>(&timeout),sizeof(timeout));
	real_data+=data;
	std::string cipher = encryptor_->encrypt(real_data);
	string cdata="C" + b64url::encode(cipher);
	session.set_session_cookie(cdata);
}